

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktx2ktx2.cpp
# Opt level: O3

int __thiscall ktxUpgrader::main(ktxUpgrader *this,int argc,char **argv)

{
  pointer pcVar1;
  size_type sVar2;
  long *plVar3;
  int iVar4;
  FILE *__stream;
  ulong uVar5;
  ostream *poVar6;
  int *piVar7;
  long lVar8;
  char *pcVar9;
  size_t sVar10;
  undefined8 uVar11;
  pointer pbVar12;
  char cVar13;
  bool bVar14;
  ktxTexture1 *texture;
  string outfile;
  string infile;
  char *orientation;
  uint orientLen;
  uint keyLen;
  char answer;
  FILE *local_260;
  long local_258 [2];
  string *local_248;
  string local_240;
  long *local_220;
  long local_218;
  long local_210 [2];
  long *local_200 [2];
  long local_1f0 [2];
  undefined4 local_1dc;
  long *local_1d8 [2];
  long local_1c8 [2];
  long *local_1b8;
  long local_1b0;
  long local_1a8 [14];
  ios_base local_138 [264];
  
  local_258[0] = 0;
  local_258[1] = 0;
  ktxApp::processCommandLine(&this->super_ktxApp,argc,argv,eAllowStdin,eNone);
  (*(this->super_ktxApp)._vptr_ktxApp[4])(this);
  pbVar12 = (this->options).super_commandOptions.infiles.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (pbVar12 < (this->options).super_commandOptions.infiles.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    local_248 = &(this->options).super_commandOptions.outfile;
    local_258[1] = 0;
    local_260 = (FILE *)0x0;
    do {
      local_220 = local_210;
      pcVar1 = (pbVar12->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_220,pcVar1,pcVar1 + pbVar12->_M_string_length);
      local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
      local_240._M_string_length = 0;
      local_240.field_2._M_local_buf[0] = '\0';
      iVar4 = std::__cxx11::string::compare((char *)&local_220);
      __stream = _stdin;
      if (iVar4 != 0) {
        local_1b8 = local_1a8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"rb","");
        __stream = fopen((char *)local_220,(char *)local_1b8);
        if (local_1b8 != local_1a8) {
          operator_delete(local_1b8,local_1a8[0] + 1);
        }
      }
      if (__stream == (FILE *)0x0) {
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(this->super_ktxApp).name._M_dataplus._M_p,
                            (this->super_ktxApp).name._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6," could not open input file \"",0x1c);
        iVar4 = std::__cxx11::string::compare((char *)&local_220);
        local_1b8 = local_1a8;
        if (iVar4 == 0) {
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"stdin","");
        }
        else {
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1b8,local_220,(long)local_220 + local_218);
        }
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,(char *)local_1b8,local_1b0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\". ",3);
        piVar7 = __errno_location();
        pcVar9 = strerror(*piVar7);
        if (pcVar9 == (char *)0x0) {
          std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
        }
        else {
          sVar10 = strlen(pcVar9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar9,sVar10);
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
LAB_0010658f:
        if (local_1b8 != local_1a8) {
          operator_delete(local_1b8,local_1a8[0] + 1);
        }
LAB_0010666a:
        local_258[1] = 2;
        bVar14 = false;
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)&local_220);
        sVar2 = (this->options).super_commandOptions.outfile._M_string_length;
        if ((iVar4 == 0) || (sVar2 != 0 || (this->options).super_commandOptions.field_0x44 != '\0'))
        {
          if (sVar2 != 0) {
            std::__cxx11::string::_M_assign((string *)&local_240);
          }
        }
        else {
          std::__cxx11::string::_M_assign((string *)&local_240);
          uVar5 = std::__cxx11::string::rfind((char)&local_240,0x2e);
          if (uVar5 != 0xffffffffffffffff) {
            if (local_240._M_string_length < uVar5) {
              uVar11 = std::__throw_out_of_range_fmt
                                 ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                                  "basic_string::erase",uVar5);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_240._M_dataplus._M_p != &local_240.field_2) {
                operator_delete(local_240._M_dataplus._M_p,
                                CONCAT71(local_240.field_2._M_allocated_capacity._1_7_,
                                         local_240.field_2._M_local_buf[0]) + 1);
              }
              if (local_220 != local_210) {
                operator_delete(local_220,local_210[0] + 1);
              }
              _Unwind_Resume(uVar11);
            }
            local_240._M_dataplus._M_p[uVar5] = '\0';
            local_240._M_string_length = uVar5;
          }
          std::__cxx11::string::append((char *)&local_240);
        }
        if ((this->options).super_commandOptions.field_0x44 == '\x01') {
          local_260 = _stdout;
        }
        else if (local_240._M_string_length != 0) {
          local_260 = (FILE *)ktxApp::fopen_write_if_not_exists(&local_240);
        }
        if (local_260 == (FILE *)0x0) {
          piVar7 = __errno_location();
          if (*piVar7 == 0x11) {
            cVar13 = (this->options).super_commandOptions.field_0x45;
            if (cVar13 == '\0') {
              iVar4 = fileno(_stdin);
              iVar4 = isatty(iVar4);
              if (iVar4 != 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Output file ",0xc);
                poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&std::cout,
                                    (this->options).super_commandOptions.outfile._M_dataplus._M_p,
                                    (this->options).super_commandOptions.outfile._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar6," exists. Overwrite? [Y or n] ",0x1d);
                std::operator>>((istream *)&std::cin,(char *)&local_1b8);
                if (local_1b8._0_1_ == (string)0x59) {
                  cVar13 = '\x01';
                }
              }
            }
            if (cVar13 != '\0') {
              local_1b8 = local_1a8;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"wb","");
              local_260 = fopen(local_240._M_dataplus._M_p,(char *)local_1b8);
              if (local_1b8 != local_1a8) {
                operator_delete(local_1b8,local_1a8[0] + 1);
              }
              if (local_260 != (FILE *)0x0) goto LAB_00105ed2;
            }
          }
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,(this->super_ktxApp).name._M_dataplus._M_p,
                              (this->super_ktxApp).name._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6," could not open output file \"",0x1d);
          pcVar9 = "stdout";
          if (((this->options).super_commandOptions.outfile._M_string_length == 0) ||
             (pcVar9 = (local_248->_M_dataplus)._M_p, pcVar9 != (pointer)0x0)) {
            sVar10 = strlen(pcVar9);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar9,sVar10);
          }
          else {
            std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\". ",3);
          pcVar9 = strerror(*piVar7);
          if (pcVar9 == (char *)0x0) {
            std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
          }
          else {
            sVar10 = strlen(pcVar9);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar9,sVar10);
          }
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
          local_260 = (FILE *)0x0;
          goto LAB_0010666a;
        }
LAB_00105ed2:
        iVar4 = ktxTexture1_CreateFromStdioStream(__stream,1,local_258);
        if (iVar4 != 0) {
          if (iVar4 == 0xf) {
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,(char *)local_220,local_218);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6," is not a KTX v1 file.",0x16)
            ;
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
          }
          else {
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,(this->super_ktxApp).name._M_dataplus._M_p,
                                (this->super_ktxApp).name._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar6," failed to create ktxTexture from ",0x22);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar6,(char *)local_220,local_218);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,": ",2);
            pcVar9 = (char *)ktxErrorString(iVar4);
            if (pcVar9 == (char *)0x0) {
              std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
            }
            else {
              sVar10 = strlen(pcVar9);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar9,sVar10);
            }
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
          }
          std::ostream::put((char)poVar6);
          std::ostream::flush();
          fclose(__stream);
          fclose(local_260);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1b8,(local_248->_M_dataplus)._M_p,(allocator<char> *)local_200
                    );
          unlink((char *)local_1b8);
          goto LAB_0010658f;
        }
        for (lVar8 = *(long *)(local_258[0] + 0x50); lVar8 != 0; lVar8 = ktxHashList_Next(lVar8)) {
          ktxHashListEntry_GetKey(lVar8,local_1d8,&local_1b8);
          plVar3 = local_1b8;
          iVar4 = strncasecmp((char *)local_1b8,"KTX",3);
          if (((iVar4 == 0) && (iVar4 = strcmp((char *)plVar3,"KTXorientation"), iVar4 != 0)) &&
             (iVar4 = strcmp((char *)plVar3,"KTXwriter"), iVar4 != 0)) {
            iVar4 = strcmp((char *)plVar3,"KTXOrientation");
            if ((iVar4 == 0) && ((this->options).super_commandOptions.field_0x46 == '\x01')) {
              ktxHashListEntry_GetValue(lVar8,&local_1dc,local_200);
              ktxHashList_AddKVPair(local_258[0] + 0x50,"KTXorientation",local_1dc,local_200[0]);
            }
            else {
              poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cerr,(this->super_ktxApp).name._M_dataplus._M_p,
                                  (this->super_ktxApp).name._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar6,": Warning: Dropping unrecognized ",0x21);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,"metadata \"",10);
              plVar3 = local_1b8;
              if (local_1b8 == (long *)0x0) {
                std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
              }
              else {
                sVar10 = strlen((char *)local_1b8);
                std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)plVar3,sVar10);
              }
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"",1);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
              std::ostream::put((char)poVar6);
              std::ostream::flush();
            }
            ktxHashList_DeleteEntry(local_258[0] + 0x50,lVar8);
          }
        }
        std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
        ktxApp::writeId(&this->super_ktxApp,(ostream *)local_1a8,
                        (this->options).super_commandOptions.test != 0);
        lVar8 = local_258[0];
        std::__cxx11::stringbuf::str();
        plVar3 = local_200[1];
        std::__cxx11::stringbuf::str();
        ktxHashList_AddKVPair(lVar8 + 0x50,"KTXwriter",(int)plVar3 + 1,local_1d8[0]);
        if (local_1d8[0] != local_1c8) {
          operator_delete(local_1d8[0],local_1c8[0] + 1);
        }
        if (local_200[0] != local_1f0) {
          operator_delete(local_200[0],local_1f0[0] + 1);
        }
        iVar4 = ktxTexture1_WriteKTX2ToStdioStream(local_258[0],local_260);
        (*(code *)**(undefined8 **)(local_258[0] + 8))();
        fclose(__stream);
        fclose(local_260);
        bVar14 = iVar4 == 0;
        if (!bVar14) {
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,(this->super_ktxApp).name._M_dataplus._M_p,
                              (this->super_ktxApp).name._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6," failed to write KTX2 file; ",0x1c);
          pcVar9 = (char *)ktxErrorString(iVar4);
          if (pcVar9 == (char *)0x0) {
            std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
          }
          else {
            sVar10 = strlen(pcVar9);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar9,sVar10);
          }
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_200,(local_248->_M_dataplus)._M_p,(allocator<char> *)local_1d8)
          ;
          unlink((char *)local_200[0]);
          if (local_200[0] != local_1f0) {
            operator_delete(local_200[0],local_1f0[0] + 1);
          }
          local_258[1] = 2;
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
        std::ios_base::~ios_base(local_138);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p,
                        CONCAT71(local_240.field_2._M_allocated_capacity._1_7_,
                                 local_240.field_2._M_local_buf[0]) + 1);
      }
      if (local_220 != local_210) {
        operator_delete(local_220,local_210[0] + 1);
      }
      pbVar12 = pbVar12 + 1;
    } while ((bool)(bVar14 & pbVar12 < (this->options).super_commandOptions.infiles.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish));
  }
  return (int)local_258[1];
}

Assistant:

int
ktxUpgrader::main(int argc, char* argv[])
{
    FILE *inf, *outf = nullptr;
    KTX_error_code result;
    ktxTexture1* texture = 0;
    int exitCode = 0;

    processCommandLine(argc, argv);
    validateOptions();

    std::vector<string>::const_iterator it;
    for (it = options.infiles.begin(); it < options.infiles.end(); it++) {
       string infile = *it;
       string outfile;

        if (infile.compare("-") == 0) {
            inf = stdin;
#if defined(_WIN32)
            /* Set "stdin" to have binary mode */
            (void)_setmode( _fileno( stdin ), _O_BINARY );
#endif
        } else {
            inf = fopenUTF8(infile, "rb");
        }

        if (inf) {
            if (infile.compare("-")
                && !options.useStdout && !options.outfile.length())
            {
                size_t dot;

                outfile = infile;
                dot = outfile.find_last_of('.');
                if (dot !=string::npos) {
                    outfile.erase(dot,string::npos);
                }
                outfile += ".ktx2";
            } else if (options.outfile.length()) {
                outfile = options.outfile;
            }

            if (options.useStdout) {
                outf = stdout;
#if defined(_WIN32)
                /* Set "stdout" to have binary mode */
                (void)_setmode( _fileno( stdout ), _O_BINARY );
#endif
            } else if (outfile.length()) {
                outf = fopen_write_if_not_exists(outfile);
            }

            if (!outf && errno == EEXIST) {
                bool force = options.force;
                if (!force) {
                    if (isatty(fileno(stdin))) {
                        char answer;
                        cout << "Output file " << options.outfile
                             << " exists. Overwrite? [Y or n] ";
                        cin >> answer;
                        if (answer == 'Y') {
                            force = true;
                        }
                    }
                }
                if (force) {
                    outf = fopenUTF8(outfile, "wb");
                }
            }

            if (outf) {
                result = ktxTexture1_CreateFromStdioStream(inf,
                                        KTX_TEXTURE_CREATE_LOAD_IMAGE_DATA_BIT,
                                        &texture);
                if (result != KTX_SUCCESS) {
                    if (result == KTX_UNKNOWN_FILE_FORMAT) {
                        cerr << infile << " is not a KTX v1 file." << endl;
                    } else if (result != KTX_SUCCESS) {
                        cerr << name
                             << " failed to create ktxTexture from " << infile
                             << ": " << ktxErrorString(result) << endl;
                    }
                    (void)fclose(inf);
                    (void)fclose(outf);
                    (void)unlinkUTF8(options.outfile.c_str());
                    exitCode = 2;
                    goto cleanup;
                }

                // Some in-the-wild KTX files have incorrect KTXOrientation
                // Warn about dropping invalid metadata.
                ktxHashListEntry* pEntry;
                for (pEntry = texture->kvDataHead;
                     pEntry != NULL;
                     pEntry = ktxHashList_Next(pEntry)) {
                    unsigned int keyLen;
                    char* key;

                    ktxHashListEntry_GetKey(pEntry, &keyLen, &key);
                    if (strncasecmp(key, "KTX", 3) == 0) {
                        if (strcmp(key, KTX_ORIENTATION_KEY)
                            && strcmp(key, KTX_WRITER_KEY)) {
                            if (strcmp(key, "KTXOrientation") == 0
                                && options.rewriteBadOrientation) {
                                    unsigned int orientLen;
                                    char* orientation;
                                    ktxHashListEntry_GetValue(pEntry,
                                                        &orientLen,
                                                        (void**)&orientation);
                                    ktxHashList_AddKVPair(&texture->kvDataHead,
                                                          KTX_ORIENTATION_KEY,
                                                          orientLen,
                                                          orientation);
                           } else {
                                cerr << name
                                     << ": Warning: Dropping unrecognized "
                                     << "metadata \"" << key << "\""
                                     << std::endl;
                            }
                            ktxHashList_DeleteEntry(&texture->kvDataHead,
                                                    pEntry);
                        }
                    }
                }

                // Add required writer metadata.
                std::stringstream writer;
                writeId(writer, options.test != 0);
                ktxHashList_AddKVPair(&texture->kvDataHead, KTX_WRITER_KEY,
                                      (ktx_uint32_t)writer.str().length() + 1,
                                      writer.str().c_str());

                result = ktxTexture1_WriteKTX2ToStdioStream(texture, outf);
                ktxTexture_Destroy(ktxTexture(texture));
                (void)fclose(inf);
                (void)fclose(outf);
                if (result != KTX_SUCCESS) {
                    cerr << name
                         << " failed to write KTX2 file; "
                         << ktxErrorString(result) << endl;
                    (void)unlinkUTF8(options.outfile.c_str());
                    exitCode = 2;
                    goto cleanup;
                }
            } else {
                cerr << name
                     << " could not open output file \""
                     << (options.outfile.length() ? options.outfile.c_str()
                                                  : "stdout")
                     << "\". " << strerror(errno) << endl;
                exitCode = 2;
                goto cleanup;
            }
        } else {
            cerr << name
                 << " could not open input file \""
                 << (infile.compare("-") ? infile : "stdin") << "\". "
                 << strerror(errno) << endl;
            exitCode = 2;
            goto cleanup;
        }
    }

cleanup:
    return exitCode;
}